

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPrint.c
# Opt level: O2

void Fxu_MatrixPrint(FILE *pFile,Fxu_Matrix *p)

{
  Fxu_Cube *pFVar1;
  Fxu_Lit *pFVar2;
  Fxu_Double *pFVar3;
  Fxu_Pair *pFVar4;
  Fxu_Single *pFVar5;
  FILE *__stream;
  Fxu_Var *pFVar6;
  long lVar7;
  Fxu_Matrix *pFVar8;
  Fxu_ListDouble *pFVar9;
  int iVar10;
  Fxu_ListVar *pFVar11;
  Fxu_ListLit *pFVar12;
  Fxu_ListPair *pFVar13;
  Fxu_ListSingle *pFVar14;
  bool bVar15;
  
  __stream = (FILE *)pFile;
  if (pFile == (FILE *)0x0) {
    __stream = fopen("matrix.txt","w");
  }
  fprintf(__stream,"Matrix has %d vars, %d cubes, %d literals, %d divisors.\n",
          (ulong)(uint)(p->lVars).nItems,(ulong)(uint)(p->lCubes).nItems,(ulong)(uint)p->nEntries,
          (ulong)(uint)p->nDivs);
  fprintf(__stream,"Divisors selected so far: single = %d, double = %d.\n",(ulong)(uint)p->nDivs1,
          (ulong)(uint)p->nDivs2);
  fputc(10,__stream);
  iVar10 = 0xc;
  while (bVar15 = iVar10 != 0, iVar10 = iVar10 + -1, bVar15) {
    fputc(0x20,__stream);
  }
  pFVar11 = &p->lVars;
  while (pFVar6 = pFVar11->pHead, pFVar6 != (Fxu_Var *)0x0) {
    fprintf(__stream,"%d",(long)pFVar6->iVar % 10 & 0xffffffff);
    pFVar11 = (Fxu_ListVar *)&pFVar6->pNext;
  }
  fputc(10,__stream);
  pFVar8 = p;
  while (pFVar1 = (pFVar8->lCubes).pHead, pFVar1 != (Fxu_Cube *)0x0) {
    fprintf(__stream,"%4d",(ulong)(uint)pFVar1->iCube);
    fwrite("  ",2,1,__stream);
    fprintf(__stream,"%4d",(ulong)(uint)pFVar1->pVar->iVar);
    fwrite("  ",2,1,__stream);
    iVar10 = -1;
    pFVar12 = &pFVar1->lLits;
    while (pFVar2 = pFVar12->pHead, pFVar2 != (Fxu_Lit *)0x0) {
      while (iVar10 = iVar10 + 1, iVar10 < pFVar2->pVar->iVar) {
        fputc(0x2e,__stream);
      }
      fputc(0x31,__stream);
      pFVar12 = (Fxu_ListLit *)&pFVar2->pHNext;
    }
    while (iVar10 = iVar10 + 1, iVar10 < (p->lVars).nItems) {
      fputc(0x2e,__stream);
    }
    fputc(10,__stream);
    pFVar8 = (Fxu_Matrix *)&pFVar1->pNext;
  }
  fputc(10,__stream);
  fwrite("The double divisors are:\n",0x19,1,__stream);
  for (lVar7 = 0; lVar7 < p->nTableSize; lVar7 = lVar7 + 1) {
    pFVar9 = p->pTable + lVar7;
    while (pFVar3 = pFVar9->pHead, pFVar3 != (Fxu_Double *)0x0) {
      pFVar4 = (pFVar3->lPairs).pHead;
      fprintf(__stream,"Divisor #%3d (lit=%d,%d) (w=%2d):  ",(ulong)(uint)pFVar3->Num,
              (ulong)(uint)pFVar4->nLits1,(ulong)(uint)pFVar4->nLits2,(ulong)(uint)pFVar3->Weight);
      pFVar13 = &pFVar3->lPairs;
      while (pFVar4 = pFVar13->pHead, pFVar4 != (Fxu_Pair *)0x0) {
        fprintf(__stream," <%d, %d> (b=%d)",(ulong)(uint)pFVar4->pCube1->iCube,
                (ulong)(uint)pFVar4->pCube2->iCube,(ulong)(uint)pFVar4->nBase);
        pFVar13 = (Fxu_ListPair *)&pFVar4->pDNext;
      }
      fputc(10,__stream);
      pFVar9 = (Fxu_ListDouble *)&pFVar3->pNext;
    }
  }
  fputc(10,__stream);
  fwrite("The cubes are:\n",0xf,1,__stream);
  pFVar8 = p;
  while (pFVar1 = (pFVar8->lCubes).pHead, pFVar1 != (Fxu_Cube *)0x0) {
    fprintf(__stream,"Cube #%3d: ",(ulong)(uint)pFVar1->iCube);
    pFVar6 = pFVar1->pVar;
    if (pFVar6->ppPairs != (Fxu_Pair ***)0x0) {
      for (lVar7 = 0; lVar7 < pFVar6->nCubes; lVar7 = lVar7 + 1) {
        pFVar4 = pFVar6->ppPairs[pFVar1->iCube][lVar7];
        if (pFVar4 != (Fxu_Pair *)0x0) {
          fprintf(__stream," <%d %d> (d=%d) (b=%d)",(ulong)(uint)pFVar4->iCube1,
                  (ulong)(uint)pFVar4->iCube2,(ulong)(uint)pFVar4->pDiv->Num,
                  (ulong)(uint)pFVar4->nBase);
          pFVar6 = pFVar1->pVar;
        }
      }
    }
    fputc(10,__stream);
    pFVar8 = (Fxu_Matrix *)&pFVar1->pNext;
  }
  fputc(10,__stream);
  fwrite("The single divisors are:\n",0x19,1,__stream);
  pFVar14 = &p->lSingles;
  while (pFVar5 = pFVar14->pHead, pFVar5 != (Fxu_Single *)0x0) {
    fprintf(__stream,"Single-cube divisor #%5d: Var1 = %4d. Var2 = %4d. Weight = %2d\n",
            (ulong)(uint)pFVar5->Num,(ulong)(uint)pFVar5->pVar1->iVar,
            (ulong)(uint)pFVar5->pVar2->iVar,(ulong)(uint)pFVar5->Weight);
    pFVar14 = (Fxu_ListSingle *)&pFVar5->pNext;
  }
  fputc(10,__stream);
  if (pFile == (FILE *)0x0) {
    fclose(__stream);
    return;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Fxu_MatrixPrint( FILE * pFile, Fxu_Matrix * p )
{
	Fxu_Var * pVar;
	Fxu_Cube * pCube;
	Fxu_Double * pDiv;
    Fxu_Single * pSingle;
	Fxu_Lit * pLit;
	Fxu_Pair * pPair;
	int i, LastNum;
	int fStdout;

	fStdout = 1;
	if ( pFile == NULL )
	{
		pFile = fopen( "matrix.txt", "w" );
		fStdout = 0;
	}

	fprintf( pFile, "Matrix has %d vars, %d cubes, %d literals, %d divisors.\n", 
		p->lVars.nItems, p->lCubes.nItems, p->nEntries, p->nDivs );
	fprintf( pFile, "Divisors selected so far: single = %d, double = %d.\n", 
		p->nDivs1, p->nDivs2 );
	fprintf( pFile, "\n" );

	// print the numbers on top of the matrix
	for ( i = 0; i < 12; i++ )
		fprintf( pFile, " " );
	Fxu_MatrixForEachVariable( p, pVar )
		fprintf( pFile, "%d", pVar->iVar % 10 );
	fprintf( pFile, "\n" );

	// print the rows
	Fxu_MatrixForEachCube( p, pCube )
	{
		fprintf( pFile, "%4d", pCube->iCube );
		fprintf( pFile, "  " );
		fprintf( pFile, "%4d", pCube->pVar->iVar );
		fprintf( pFile, "  " );

		// print the literals
		LastNum = -1;
		Fxu_CubeForEachLiteral( pCube, pLit )
		{
			for ( i = LastNum + 1; i < pLit->pVar->iVar; i++ )
				fprintf( pFile, "." );
			fprintf( pFile, "1" );
			LastNum = i;
		}
		for ( i = LastNum + 1; i < p->lVars.nItems; i++ )
			fprintf( pFile, "." );
		fprintf( pFile, "\n" );
	}
	fprintf( pFile, "\n" );

	// print the double-cube divisors
	fprintf( pFile, "The double divisors are:\n" );
	Fxu_MatrixForEachDouble( p, pDiv, i )
	{
		fprintf( pFile, "Divisor #%3d (lit=%d,%d) (w=%2d):  ", 
			pDiv->Num, pDiv->lPairs.pHead->nLits1, 
            pDiv->lPairs.pHead->nLits2, pDiv->Weight );
		Fxu_DoubleForEachPair( pDiv, pPair )
			fprintf( pFile, " <%d, %d> (b=%d)", 
				pPair->pCube1->iCube, pPair->pCube2->iCube, pPair->nBase );
		fprintf( pFile, "\n" );
	}
    fprintf( pFile, "\n" );

	// print the divisors associated with each cube
	fprintf( pFile, "The cubes are:\n" );
	Fxu_MatrixForEachCube( p, pCube )
	{
		fprintf( pFile, "Cube #%3d: ", pCube->iCube );
        if ( pCube->pVar->ppPairs )
        {
		    Fxu_CubeForEachPair( pCube, pPair, i )
				fprintf( pFile, " <%d %d> (d=%d) (b=%d)", 
					pPair->iCube1, pPair->iCube2, pPair->pDiv->Num, pPair->nBase );
        }
		fprintf( pFile, "\n" );
	}
    fprintf( pFile, "\n" );

	// print the single-cube divisors
	fprintf( pFile, "The single divisors are:\n" );
	Fxu_MatrixForEachSingle( p, pSingle )
	{
		fprintf( pFile, "Single-cube divisor #%5d: Var1 = %4d. Var2 = %4d. Weight = %2d\n", 
			pSingle->Num, pSingle->pVar1->iVar, pSingle->pVar2->iVar, pSingle->Weight );
	}
    fprintf( pFile, "\n" );

/*
    {
        int Index;
		fprintf( pFile, "Distribution of divisors in the hash table:\n" );
        for ( Index = 0; Index < p->nTableSize; Index++ )
            fprintf( pFile, " %d", p->pTable[Index].nItems );
		fprintf( pFile, "\n" );
    }
*/
	if ( !fStdout )
		fclose( pFile );
}